

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObject::GetSharedData
          (CSharedMemoryObject *this,CPalThread *pthr,LockType eLockRequest,IDataLock **ppDataLock,
          void **ppvSharedData)

{
  DWORD DVar1;
  IDataLock *local_38;
  IDataLock *pDataLock;
  void **ppvSharedData_local;
  IDataLock **ppDataLock_local;
  CPalThread *pCStack_18;
  LockType eLockRequest_local;
  CPalThread *pthr_local;
  CSharedMemoryObject *this_local;
  
  pDataLock = (IDataLock *)ppvSharedData;
  ppvSharedData_local = ppDataLock;
  ppDataLock_local._4_4_ = eLockRequest;
  pCStack_18 = pthr;
  pthr_local = (CPalThread *)this;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","GetSharedData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x3c0);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if ((ppDataLock_local._4_4_ != ReadLock) && (ppDataLock_local._4_4_ != WriteLock)) {
    fprintf(_stderr,"] %s %s:%d","GetSharedData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x3c1);
    fprintf(_stderr,"Expression: ReadLock == eLockRequest || WriteLock == eLockRequest\n");
  }
  if (ppvSharedData_local == (void **)0x0) {
    fprintf(_stderr,"] %s %s:%d","GetSharedData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x3c2);
    fprintf(_stderr,"Expression: NULL != ppDataLock\n");
  }
  if (pDataLock == (IDataLock *)0x0) {
    fprintf(_stderr,"] %s %s:%d","GetSharedData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x3c3);
    fprintf(_stderr,"Expression: NULL != ppvSharedData\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  DVar1 = CObjectType::GetSharedDataSize((this->super_CPalObjectBase).m_pot);
  if (DVar1 == 0) {
    fprintf(_stderr,"] %s %s:%d","GetSharedData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x3cf);
    fprintf(_stderr,"Expression: 0 < m_pot->GetSharedDataSize()\n");
  }
  if (this->m_ObjectDomain == ProcessLocalObject) {
    CSimpleDataLock::AcquireLock(&this->m_sdlSharedData,pCStack_18,&local_38);
    if (this->m_ObjectDomain == SharedObject) {
      (**local_38->_vptr_IDataLock)(local_38,pCStack_18,0);
      CSimpleSharedMemoryLock::AcquireLock(&this->m_ssmlSharedData,pCStack_18,&local_38);
    }
  }
  else {
    CSimpleSharedMemoryLock::AcquireLock(&this->m_ssmlSharedData,pCStack_18,&local_38);
  }
  *ppvSharedData_local = local_38;
  pDataLock->_vptr_IDataLock = (_func_int **)this->m_pvSharedData;
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return 0;
  }
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObject::GetSharedData(
    CPalThread *pthr,
    LockType eLockRequest,
    IDataLock **ppDataLock,             // OUT
    void **ppvSharedData                // OUT
    )
{
    IDataLock *pDataLock;

    _ASSERTE(NULL != pthr);
    _ASSERTE(ReadLock == eLockRequest || WriteLock == eLockRequest);
    _ASSERTE(NULL != ppDataLock);
    _ASSERTE(NULL != ppvSharedData);

    ENTRY("CSharedMemoryObject::GetSharedData"
        "(this = %p, pthr = %p, eLockRequest = %d, ppDataLock = %p,"
        " ppvSharedData = %p)\n",
        this,
        pthr,
        eLockRequest,
        ppDataLock,
        ppvSharedData
        );

    _ASSERTE(0 < m_pot->GetSharedDataSize());
    
    if (ProcessLocalObject == m_ObjectDomain)
    {
        //
        // We need to grab the local shared data lock and re-check
        // the object's domain, as there's a chance the object might
        // have been promoted after we made the above check but before
        // we grabbed the lock
        //

        m_sdlSharedData.AcquireLock(pthr, &pDataLock);

        if (SharedObject == m_ObjectDomain)
        {
            pDataLock->ReleaseLock(pthr, FALSE);
            m_ssmlSharedData.AcquireLock(pthr, &pDataLock);
        }
    }
    else
    {
        //
        // A shared object can never transition back to local,
        // so there's no need to recheck the domain on this path
        //
        
        m_ssmlSharedData.AcquireLock(pthr, &pDataLock);
    }

    *ppDataLock = pDataLock;
    *ppvSharedData = m_pvSharedData;

    LOGEXIT("CSharedMemoryObject::GetSharedData returns %d\n", NO_ERROR);
    
    return NO_ERROR;
}